

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_reference_examples.cpp
# Opt level: O0

void density_tests::dynamic_reference_test_cv_t<int_const_volatile&,int_const&>(void)

{
  cv_qual CV2;
  cv_qual CV1;
  
  return;
}

Assistant:

void dynamic_reference_test_cv_t()
    {
        using namespace density;

        //! [is_less_or_equal_cv_qualified example 2]
        static_assert(std::is_constructible<T1, T2>::value ==
            is_less_or_equal_cv_qualified(
                cv_qual_of<typename std::remove_reference<T2>::type>::value,
                cv_qual_of<typename std::remove_reference<T1>::type>::value), "");
        //! [is_less_or_equal_cv_qualified example 2]

        constexpr cv_qual CV1 = cv_qual_of<typename std::remove_reference<T1>::type>::value;
        constexpr cv_qual CV2 = cv_qual_of<typename std::remove_reference<T2>::type>::value;

        // test the viability of the constructor taking a raw reference
        static_assert(std::is_constructible<T1, T2>::value ==
            std::is_constructible<dynamic_reference<int, CV1>, T2>::value, "");

        // test the viability of the generalized copy-constructor
        static_assert(std::is_constructible<T1, T2>::value ==
            std::is_constructible<dynamic_reference<int, CV1>, dynamic_reference<int, CV2>>::value, "");
    }